

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestPartResult
          (PrettyUnitTestResultPrinter *this,TestPartResult *result)

{
  ostream *poVar1;
  stringstream *this_00;
  size_t sVar2;
  int in_ECX;
  internal *this_01;
  char *pcVar3;
  string local_60;
  string local_40;
  
  if (result->type_ != kSuccess) {
    this_00 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this_00);
    poVar1 = (ostream *)(this_00 + 0x10);
    *(undefined8 *)(this_00 + *(long *)(*(long *)(this_00 + 0x10) + -0x18) + 0x18) = 0x11;
    this_01 = (internal *)(result->file_name_)._M_string_length;
    if (this_01 != (internal *)0x0) {
      this_01 = (internal *)(result->file_name_)._M_dataplus._M_p;
    }
    FormatFileLocation_abi_cxx11_
              (&local_40,this_01,(char *)(ulong)(uint)result->line_number_,in_ECX);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if ((ulong)result->type_ < 3) {
      pcVar3 = &DAT_0013fd8c + *(int *)(&DAT_0013fd8c + (ulong)result->type_ * 4);
    }
    else {
      pcVar3 = "Unknown result type";
    }
    sVar2 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,sVar2);
    pcVar3 = (result->message_)._M_dataplus._M_p;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "(null)";
      sVar2 = 6;
    }
    else {
      sVar2 = strlen(pcVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,sVar2);
    StringStreamToString(&local_60,(stringstream *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    (**(code **)(*(long *)this_00 + 8))(this_00);
    puts(local_60._M_dataplus._M_p);
    fflush(_stdout);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    fflush(_stdout);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestPartResult(
    const TestPartResult& result) {
  // If the test part succeeded, we don't need to do anything.
  if (result.type() == TestPartResult::kSuccess)
    return;

  // Print failure message from the assertion (e.g. expected this and got that).
  PrintTestPartResult(result);
  fflush(stdout);
}